

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapOneofField<false>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  uint32_t number;
  uint32_t number_00;
  double *pdVar1;
  uint *puVar2;
  float *pfVar3;
  bool *pbVar4;
  FieldDescriptor *field;
  Message *sub_message;
  int *piVar5;
  undefined1 *unaff_RBX;
  LocalVarWrapper temp;
  FieldDescriptor *local_c0;
  Reflection *local_b0;
  Message *local_a8;
  FieldDescriptor *local_a0;
  string local_98;
  CppType local_74;
  Message *local_70;
  string local_68;
  Reflection *local_48;
  Message *local_40;
  FieldDescriptor *local_38;
  
  if ((oneof_descriptor->field_count_ == 1) && ((oneof_descriptor->fields_->field_0x1 & 2) != 0)) {
    SwapOneofField<false>();
switchD_002831fe_default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x23c);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (&local_98,0x14,"unimplemented type: ");
    local_74 = *(CppType *)(unaff_RBX + (ulong)local_c0->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
              ((LogMessage *)&local_98,&local_74);
    goto LAB_0028387b;
  }
  number = GetOneofCase(this,lhs,oneof_descriptor);
  number_00 = GetOneofCase(this,rhs,oneof_descriptor);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (number == 0) {
    local_c0 = (FieldDescriptor *)0x0;
    goto LAB_00283334;
  }
  local_c0 = Descriptor::FindFieldByNumber(this->descriptor_,number);
  unaff_RBX = FieldDescriptor::kTypeToCppTypeMap;
  local_b0 = this;
  local_a8 = lhs;
  local_a0 = local_c0;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_c0->type_ * 4)) {
  case 1:
    puVar2 = (uint *)GetRaw<int>(this,lhs,local_c0);
    goto LAB_0028328d;
  case 2:
    pdVar1 = (double *)GetRaw<long>(this,lhs,local_c0);
    goto LAB_002832ab;
  case 3:
    puVar2 = GetRaw<unsigned_int>(this,lhs,local_c0);
    goto LAB_0028328d;
  case 4:
    pdVar1 = (double *)GetRaw<unsigned_long>(this,lhs,local_c0);
LAB_002832ab:
    local_70 = (Message *)*pdVar1;
    break;
  case 5:
    pdVar1 = GetRaw<double>(this,lhs,local_c0);
    local_70 = (Message *)*pdVar1;
    break;
  case 6:
    pfVar3 = GetRaw<float>(this,lhs,local_c0);
    local_70 = (Message *)CONCAT44(local_70._4_4_,*pfVar3);
    break;
  case 7:
    pbVar4 = GetRaw<bool>(this,lhs,local_c0);
    local_70 = (Message *)CONCAT71(local_70._1_7_,*pbVar4);
    break;
  case 8:
    puVar2 = (uint *)GetRaw<int>(this,lhs,local_c0);
LAB_0028328d:
    local_70 = (Message *)CONCAT44(local_70._4_4_,*puVar2);
    break;
  case 9:
    GetString_abi_cxx11_(&local_98,this,lhs,local_c0);
    std::__cxx11::string::_M_assign((string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    break;
  case 10:
    local_70 = ReleaseMessage(this,lhs,local_c0,(MessageFactory *)0x0);
    break;
  default:
    goto switchD_002831fe_default;
  }
LAB_00283334:
  if (number_00 == 0) {
    ClearOneof(this,lhs,oneof_descriptor);
  }
  else {
    field = Descriptor::FindFieldByNumber(this->descriptor_,number_00);
    local_a0 = field;
    local_38 = field;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      piVar5 = GetRaw<int>(this,rhs,field);
      local_98._M_dataplus._M_p._0_4_ = (float)*piVar5;
      SetField<int>(local_b0,local_a8,local_a0,(int *)&local_98);
      break;
    case 2:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      pdVar1 = (double *)GetRaw<long>(this,rhs,field);
      local_98._M_dataplus._M_p = (pointer)*pdVar1;
      SetField<long>(local_b0,local_a8,local_a0,(long *)&local_98);
      break;
    case 3:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      puVar2 = GetRaw<unsigned_int>(this,rhs,field);
      local_98._M_dataplus._M_p._0_4_ = (float)*puVar2;
      SetField<unsigned_int>(local_b0,local_a8,local_a0,(uint *)&local_98);
      break;
    case 4:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      pdVar1 = (double *)GetRaw<unsigned_long>(this,rhs,field);
      local_98._M_dataplus._M_p = (pointer)*pdVar1;
      SetField<unsigned_long>(local_b0,local_a8,local_a0,(unsigned_long *)&local_98);
      break;
    case 5:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      pdVar1 = GetRaw<double>(this,rhs,field);
      local_98._M_dataplus._M_p = (pointer)*pdVar1;
      SetField<double>(local_b0,local_a8,local_a0,(double *)&local_98);
      break;
    case 6:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      pfVar3 = GetRaw<float>(this,rhs,field);
      local_98._M_dataplus._M_p._0_4_ = *pfVar3;
      SetField<float>(local_b0,local_a8,local_a0,(float *)&local_98);
      break;
    case 7:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      pbVar4 = GetRaw<bool>(this,rhs,field);
      local_98._M_dataplus._M_p._0_1_ = *pbVar4;
      SetField<bool>(local_b0,local_a8,local_a0,(bool *)&local_98);
      break;
    case 8:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      piVar5 = GetRaw<int>(this,rhs,field);
      local_98._M_dataplus._M_p._0_4_ = (float)*piVar5;
      SetField<int>(local_b0,local_a8,local_a0,(int *)&local_98);
      break;
    case 9:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      GetString_abi_cxx11_(&local_98,this,rhs,field);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_b0,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      break;
    case 10:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      sub_message = ReleaseMessage(this,rhs,field,(MessageFactory *)0x0);
      SetAllocatedMessage(local_b0,local_a8,sub_message,local_a0);
      break;
    default:
      local_b0 = this;
      local_a8 = lhs;
      local_48 = this;
      local_40 = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_98,0x14,"unimplemented type: ");
      local_74 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                ((LogMessage *)&local_98,&local_74);
      goto LAB_0028387b;
    }
  }
  if (number == 0) {
    ClearOneof(this,rhs,oneof_descriptor);
  }
  else {
    local_38 = local_c0;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_c0->type_ * 4)) {
    case 1:
      local_98._M_dataplus._M_p._0_4_ = (float)local_70._0_4_;
      local_48 = this;
      local_40 = rhs;
      SetField<int>(this,rhs,local_c0,(int *)&local_98);
      break;
    case 2:
      local_98._M_dataplus._M_p = (pointer)local_70;
      local_48 = this;
      local_40 = rhs;
      SetField<long>(this,rhs,local_c0,(long *)&local_98);
      break;
    case 3:
      local_98._M_dataplus._M_p._0_4_ = (float)local_70._0_4_;
      local_48 = this;
      local_40 = rhs;
      SetField<unsigned_int>(this,rhs,local_c0,(uint *)&local_98);
      break;
    case 4:
      local_98._M_dataplus._M_p = (pointer)local_70;
      local_48 = this;
      local_40 = rhs;
      SetField<unsigned_long>(this,rhs,local_c0,(unsigned_long *)&local_98);
      break;
    case 5:
      local_98._M_dataplus._M_p = (pointer)local_70;
      local_48 = this;
      local_40 = rhs;
      SetField<double>(this,rhs,local_c0,(double *)&local_98);
      break;
    case 6:
      local_98._M_dataplus._M_p._0_4_ = (float)local_70._0_4_;
      local_48 = this;
      local_40 = rhs;
      SetField<float>(this,rhs,local_c0,(float *)&local_98);
      break;
    case 7:
      local_98._M_dataplus._M_p._0_1_ = local_70._0_1_;
      local_48 = this;
      local_40 = rhs;
      SetField<bool>(this,rhs,local_c0,(bool *)&local_98);
      break;
    case 8:
      local_98._M_dataplus._M_p._0_4_ = (float)local_70._0_4_;
      local_48 = this;
      local_40 = rhs;
      SetField<int>(this,rhs,local_c0,(int *)&local_98);
      break;
    case 9:
      local_48 = this;
      local_40 = rhs;
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_48,&local_68);
      break;
    case 10:
      local_48 = this;
      local_40 = rhs;
      SetAllocatedMessage(this,rhs,local_70,local_c0);
      break;
    default:
      local_48 = this;
      local_40 = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_98,0x14,"unimplemented type: ");
      local_74 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_c0->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                ((LogMessage *)&local_98,&local_74);
LAB_0028387b:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(absl::Cord*, cord, Cord);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
      absl::Cord* type_cord;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, cord, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}